

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

Value * __thiscall cashew::Value::setArray(Value *this,ArrayStorage *a)

{
  size_t sVar1;
  ArrayStorage *pAVar2;
  
  free(this,a);
  this->type = Array;
  pAVar2 = (ArrayStorage *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  (pAVar2->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).data = (Ref *)0x0;
  (pAVar2->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements = 0;
  (pAVar2->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).allocatedElements = 0;
  (this->field_1).arr = pAVar2;
  (pAVar2->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).allocatedElements =
       (a->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).allocatedElements;
  sVar1 = (a->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements;
  (pAVar2->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).data =
       (a->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).data;
  (pAVar2->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements = sVar1;
  return this;
}

Assistant:

Value& setArray(ArrayStorage& a) {
    free();
    type = Array;
    arr = arena.alloc<ArrayStorage>();
    *arr = a;
    return *this;
  }